

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O1

int __thiscall chatter::Protocol::connect(Protocol *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  PeerState PVar1;
  ssize_t in_RAX;
  uint64_t uVar2;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  undefined4 in_register_00000034;
  Peer *pPVar3;
  int in_R8D;
  ptr p;
  Packet *local_40;
  Peer *local_38;
  Packet *local_30;
  Peer *local_28;
  
  pPVar3 = (Peer *)CONCAT44(in_register_00000034,__fd);
  PVar1 = pPVar3->m_state;
  if (PVar1 == DISCONNECTED) {
    pPVar3->m_state = CONNECTION_REQUESTED;
    uVar2 = Host::timestamp_now(this->m_host);
    pPVar3->m_connect_ts = uVar2;
    Packet::create((Packet *)&local_40,0,'\0');
    local_40->m_peer = pPVar3;
    Packet::set_type(local_40,CONNECT_REQUEST);
    Packet::set_flag(local_40,RELIABLE);
    local_30 = local_40;
    local_28 = local_38;
    if (local_38 != (Peer *)0x0) {
      local_40 = (Packet *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38->m_address).m_address = (local_38->m_address).m_address + 1;
        UNLOCK();
      }
      else {
        (local_38->m_address).m_address = (local_38->m_address).m_address + 1;
      }
    }
    in_RAX = send(this,(int)&local_30,(void *)0x1,(size_t)local_40,in_R8D);
    if (local_28 != (Peer *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
      in_RAX = extraout_RAX;
    }
    if (local_38 != (Peer *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      in_RAX = extraout_RAX_00;
    }
  }
  return (int)CONCAT71((int7)((ulong)in_RAX >> 8),PVar1 == DISCONNECTED);
}

Assistant:

bool Protocol::connect(Peer* peer)
{
    if (peer->m_state != PeerState::DISCONNECTED)
        return false;

    peer->m_state = PeerState::CONNECTION_REQUESTED;
    peer->m_connect_ts = m_host->timestamp_now();

    auto p = Packet::create();
    p->m_peer = peer;
    p->set_type(PacketType::CONNECT_REQUEST);
    p->set_flag(PacketFlag::RELIABLE);

    send(p, true);

    return true;
}